

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_get_utf8(archive *a,archive_mstring *aes,char **p)

{
  wchar_t wVar1;
  archive_string_conv *sc_00;
  wchar_t r;
  archive_string_conv *sc;
  char **p_local;
  archive_mstring *aes_local;
  archive *a_local;
  
  if ((aes->aes_set & 2U) == 0) {
    *p = (char *)0x0;
    if ((aes->aes_set & 1U) == 0) {
      a_local._4_4_ = L'\0';
    }
    else {
      sc_00 = archive_string_conversion_to_charset(a,"UTF-8",L'\x01');
      if (sc_00 == (archive_string_conv *)0x0) {
        a_local._4_4_ = L'\xffffffff';
      }
      else {
        wVar1 = archive_strncpy_l(&aes->aes_mbs,(aes->aes_mbs).s,(aes->aes_mbs).length,sc_00);
        if (a == (archive *)0x0) {
          free_sconv_object(sc_00);
        }
        if (wVar1 == L'\0') {
          aes->aes_set = aes->aes_set | 2;
          *p = (aes->aes_utf8).s;
          a_local._4_4_ = L'\0';
        }
        else {
          a_local._4_4_ = L'\xffffffff';
        }
      }
    }
  }
  else {
    *p = (aes->aes_utf8).s;
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

int
archive_mstring_get_utf8(struct archive *a, struct archive_mstring *aes,
  const char **p)
{
	struct archive_string_conv *sc;
	int r;

	/* If we already have a UTF8 form, return that immediately. */
	if (aes->aes_set & AES_SET_UTF8) {
		*p = aes->aes_utf8.s;
		return (0);
	}

	*p = NULL;
	if (aes->aes_set & AES_SET_MBS) {
		sc = archive_string_conversion_to_charset(a, "UTF-8", 1);
		if (sc == NULL)
			return (-1);/* Couldn't allocate memory for sc. */
		r = archive_strncpy_l(&(aes->aes_mbs), aes->aes_mbs.s,
		    aes->aes_mbs.length, sc);
		if (a == NULL)
			free_sconv_object(sc);
		if (r == 0) {
			aes->aes_set |= AES_SET_UTF8;
			*p = aes->aes_utf8.s;
			return (0);/* success. */
		} else
			return (-1);/* failure. */
	}
	return (0);/* success. */
}